

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderBuiltinPrecisionTests.cpp
# Opt level: O3

IVal * vkt::shaderexecutor::ContainerTraits<tcu::Vector<int,_3>,_tcu::Vector<tcu::Interval,_3>_>::
       doRound(IVal *__return_storage_ptr__,FloatFormat *fmt,Vector<int,_3> *value)

{
  bool *pbVar1;
  long lVar2;
  Interval *pIVar3;
  int ndx;
  Interval local_60;
  Interval local_48;
  
  lVar2 = 8;
  do {
    *(undefined1 *)((long)__return_storage_ptr__->m_data + lVar2 + -8) = 0;
    pbVar1 = &__return_storage_ptr__->m_data[0].m_hasNaN + lVar2;
    *(undefined8 *)pbVar1 = 0x7ff0000000000000;
    *(double *)(pbVar1 + 8) = -INFINITY;
    lVar2 = lVar2 + 0x18;
  } while (lVar2 != 0x50);
  lVar2 = 8;
  do {
    *(undefined1 *)((long)__return_storage_ptr__->m_data + lVar2 + -8) = 0;
    pbVar1 = &__return_storage_ptr__->m_data[0].m_hasNaN + lVar2;
    *(undefined8 *)pbVar1 = 0x7ff0000000000000;
    *(double *)(pbVar1 + 8) = -INFINITY;
    lVar2 = lVar2 + 0x18;
  } while (lVar2 != 0x50);
  lVar2 = 0;
  pIVar3 = __return_storage_ptr__->m_data;
  do {
    local_60.m_lo = (double)value->m_data[lVar2];
    local_60.m_hasNaN = false;
    local_60.m_hi = local_60.m_lo;
    tcu::FloatFormat::roundOut(&local_48,fmt,&local_60,false);
    pIVar3->m_hi = local_48.m_hi;
    pIVar3->m_hasNaN = local_48.m_hasNaN;
    *(undefined7 *)&pIVar3->field_0x1 = local_48._1_7_;
    pIVar3->m_lo = local_48.m_lo;
    lVar2 = lVar2 + 1;
    pIVar3 = pIVar3 + 1;
  } while (lVar2 != 3);
  return __return_storage_ptr__;
}

Assistant:

static IVal			doRound			(const FloatFormat& fmt, T value)
	{
		IVal ret;

		for (int ndx = 0; ndx < T::SIZE; ++ndx)
			ret[ndx] = round(fmt, value[ndx]);

		return ret;
	}